

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::operator()
          (quadratic_cost_type<double> *this,int index,bit_array *x)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  double local_28;
  
  piVar1 = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  lVar3 = (long)index;
  local_28 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl[lVar3];
  lVar4 = (long)piVar1[lVar3];
  lVar3 = piVar1[lVar3 + 1] - lVar4;
  lVar4 = lVar4 << 4;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    iVar2 = bit_array::operator[]
                      (x,*(int *)((long)&((this->quadratic_elements)._M_t.
                                          super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                          .
                                          super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                                         ._M_head_impl)->id + lVar4));
    if (iVar2 != 0) {
      local_28 = local_28 +
                 *(double *)
                  ((long)&((this->quadratic_elements)._M_t.
                           super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                           .
                           super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                          ._M_head_impl)->factor + lVar4);
    }
    lVar4 = lVar4 + 0x10;
  }
  return local_28;
}

Assistant:

Float operator()(int index, const bit_array& x) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            if (x[quadratic_elements[first].id])
                ret += quadratic_elements[first].factor;

        return ret;
    }